

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Account::account_data_in_tabular_format(Account *this)

{
  ostream *poVar1;
  pointer ppVar2;
  int local_2c;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  int local_20;
  int local_1c;
  int i;
  Account *local_10;
  Account *this_local;
  
  local_10 = this;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->account_number);
  poVar1 = std::operator<<(poVar1,"\t\t\t\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->client_id);
  poVar1 = std::operator<<(poVar1,"\t\t\t\t\t");
  local_1c = (int)this->client_class;
  _i = std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&client_types_abi_cxx11_,&local_1c);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&i);
  std::operator<<(poVar1,(string *)&ppVar2->second);
  for (local_20 = 0; local_20 < 0xf; local_20 = local_20 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  local_2c = (int)this->account_type;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&account_types_abi_cxx11_,&local_2c);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_28);
  std::operator<<((ostream *)&std::cout,(string *)&ppVar2->second);
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->deposit);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Account::account_data_in_tabular_format(){
    /*!
     * It shows accoutn details in a tabular format :
     * account number, client id, account type, deposit amount
     */
    std::cout<<account_number<<"\t\t\t\t\t"<<client_id<<"\t\t\t\t\t"<<client_types.find(client_class)->second;
    int i;
    for(i=0;i<15;i++)
    {
        std::cout<<" ";
    }
    std::cout<<account_types.find(account_type)->second;
    for(i=0;i<10;i++)
    {
        std::cout<<" ";
    }
    std::cout<<deposit<<std::endl;
}